

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O3

void __thiscall
lunasvg::SVGTextFragmentsBuilder::handleElement
          (SVGTextFragmentsBuilder *this,SVGTextPositioningElement *element)

{
  pointer pSVar1;
  pointer pSVar2;
  _List_node_base *p_Var3;
  SVGTextNode *node;
  SVGTextPositioningElement *element_00;
  pointer pSVar4;
  SVGGraphicsElement *pSVar5;
  char cVar6;
  int iVar7;
  SVGTextPositioningElement *local_48;
  size_type local_40;
  size_type local_38;
  
  pSVar1 = (this->m_textPositions).
           super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pSVar2 = (this->m_textPositions).
           super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_40 = this->m_text->_M_string_length;
  local_48 = element;
  local_38 = local_40;
  std::vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>>::
  emplace_back<lunasvg::SVGTextPositioningElement_const*&,unsigned_long,unsigned_long>
            ((vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>> *)
             &this->m_textPositions,&local_48,&local_38,&local_40);
  pSVar5 = &local_48->super_SVGGraphicsElement;
  p_Var3 = (local_48->super_SVGGraphicsElement).super_SVGElement.m_children.
           super__List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var3 == (_List_node_base *)&(pSVar5->super_SVGElement).m_children) {
      pSVar4 = (this->m_textPositions).
               super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(SVGTextPositioningElement **)((long)pSVar1 + ((long)pSVar4 - (long)pSVar2)) == local_48)
      {
        *(size_type *)((long)pSVar1 + (long)pSVar4 + (0x10 - (long)pSVar2)) =
             this->m_text->_M_string_length;
        return;
      }
      __assert_fail("position.node == element",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                    ,0x144,
                    "void lunasvg::SVGTextFragmentsBuilder::handleElement(const SVGTextPositioningElement *)"
                   );
    }
    cVar6 = (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x10))();
    node = (SVGTextNode *)p_Var3[1]._M_next;
    if (cVar6 == '\0') {
      iVar7 = (*(node->super_SVGNode)._vptr_SVGNode[7])(node);
      if ((char)iVar7 != '\0') {
        element_00 = (SVGTextPositioningElement *)p_Var3[1]._M_next;
        if ((element_00 == (SVGTextPositioningElement *)0x0) ||
           (iVar7 = (*(element_00->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.
                      _vptr_SVGNode[7])(element_00), (char)iVar7 == '\0')) {
          __assert_fail("node && node->isTextPositioningElement()",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                        ,0x11,
                        "const SVGTextPositioningElement *lunasvg::toSVGTextPositioningElement(const SVGNode *)"
                       );
        }
        handleElement(this,element_00);
      }
    }
    else {
      if ((node == (SVGTextNode *)0x0) ||
         (iVar7 = (*(node->super_SVGNode)._vptr_SVGNode[2])(node), (char)iVar7 == '\0')) {
        __assert_fail("node && node->isTextNode()",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                      ,0xb,"const SVGTextNode *lunasvg::toSVGTextNode(const SVGNode *)");
      }
      handleText(this,node);
    }
    p_Var3 = p_Var3->_M_next;
  } while( true );
}

Assistant:

void SVGTextFragmentsBuilder::handleElement(const SVGTextPositioningElement* element)
{
    const auto itemIndex = m_textPositions.size();
    m_textPositions.emplace_back(element, m_text.length(), m_text.length());
    for(const auto& child : element->children()) {
        if(child->isTextNode()) {
            handleText(toSVGTextNode(child.get()));
        } else if(child->isTextPositioningElement()) {
            handleElement(toSVGTextPositioningElement(child.get()));
        }
    }

    auto& position = m_textPositions[itemIndex];
    assert(position.node == element);
    position.endOffset = m_text.length();
}